

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_dynamic_content.hpp
# Opt level: O1

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
serve_dynamic_content<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,string *uri)

{
  size_t __n;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  string *psVar5;
  error_code *peVar6;
  error_category *peVar7;
  undefined8 uVar8;
  descriptor<pstore::details::posix_descriptor_traits> dVar9;
  descriptor<pstore::details::posix_descriptor_traits> dVar10;
  descriptor<pstore::details::posix_descriptor_traits> dVar11;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>_(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<const_unsigned_char,__1L>_&),_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  *__middle;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> command;
  query_container arguments;
  long *local_d8;
  size_t local_d0;
  long local_c8 [2];
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *local_b8;
  http *local_b0;
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *local_a8;
  descriptor<pstore::details::posix_descriptor_traits> local_a0;
  long local_98 [2];
  undefined8 local_88;
  undefined8 uStack_80;
  code *local_78;
  code *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_a8 = (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
              *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,&dynamic_path,0x125bee);
  dVar9 = io._M_data[1];
  if ((ulong)local_a0 <= (ulong)io._M_data[1]) {
    dVar9 = local_a0;
  }
  if (dVar9 == (descriptor<pstore::details::posix_descriptor_traits>)0x0) {
    dVar11 = (descriptor<pstore::details::posix_descriptor_traits>)0x0;
  }
  else {
    dVar10 = (descriptor<pstore::details::posix_descriptor_traits>)0x0;
    do {
      dVar11 = dVar10;
      if ((_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
           )*(char *)((long)*io._M_data + (long)dVar10) != local_a8[(long)dVar10]) break;
      dVar10 = (descriptor<pstore::details::posix_descriptor_traits>)((long)dVar10 + 1);
      dVar11 = dVar9;
    } while (dVar9 != dVar10);
  }
  if (dVar11 != local_a0) {
    assert_failed("details::starts_with (uri, dynamic_path)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/serve_dynamic_content.hpp"
                  ,0x7b);
  }
  if (local_a8 !=
      (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
       *)local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  local_b8 = sender;
  if (io._M_data[1] == (descriptor<pstore::details::posix_descriptor_traits>)0x5) {
    io._M_data[1] = (descriptor<pstore::details::posix_descriptor_traits>)0x0;
    *(undefined1 *)*io._M_data = 0;
  }
  else {
    std::__cxx11::string::_M_erase((ulong)io._M_data,0);
  }
  uVar3 = std::__cxx11::string::find((char)io._M_data,0x3f);
  std::__cxx11::string::substr((ulong)&local_d8,(ulong)io._M_data);
  if (uVar3 == 0xffffffffffffffff) {
    begin._M_current = (char *)((long)*io._M_data + (long)io._M_data[1]);
  }
  else {
    uVar4 = 0x7ffffffffffffffe;
    if (uVar3 < 0x7ffffffffffffffe) {
      uVar4 = uVar3;
    }
    begin._M_current = (char *)((long)*io._M_data + uVar4 + 1);
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  if (begin._M_current != (char *)((long)*io._M_data + (long)io._M_data[1])) {
    query_to_kvp<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,pstore::http::insert_iterator<std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>
              (begin,(char *)((long)*io._M_data + (long)io._M_data[1]),
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_68);
  }
  psVar5 = (string *)
           details::
           get_commands<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                     ();
  local_a8 = (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
              *)local_98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_d8,local_d0 + (long)local_d8);
  local_88 = 0;
  uStack_80 = 0;
  local_70 = std::
             _Function_handler<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>_(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<const_unsigned_char,_-1L>_&),_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/serve_dynamic_content.hpp:149:37)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>_(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<const_unsigned_char,_-1L>_&),_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/serve_dynamic_content.hpp:149:37)>
             ::_M_manager;
  uVar1 = std::__cxx11::string::compare(psVar5);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  uVar1 = uVar1 >> 0x19 & 0xffffffc0;
  if (local_a8 !=
      (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
       *)local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if (uVar1 == 0) {
    psVar5 = psVar5 + uVar1;
    __n = *(size_t *)(psVar5 + 8);
    if ((__n == local_d0) &&
       ((__n == 0 || (iVar2 = bcmp(*(void **)psVar5,local_d8,__n), iVar2 == 0)))) {
      local_a8 = local_b8;
      local_b0 = this;
      if (*(long *)(psVar5 + 0x30) == 0) {
        uVar8 = std::__throw_bad_function_call();
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_68);
        if (local_d8 != local_c8) {
          operator_delete(local_d8,local_c8[0] + 1);
        }
        _Unwind_Resume(uVar8);
      }
      (**(code **)(psVar5 + 0x38))
                (__return_storage_ptr__,psVar5 + 0x20,&local_b0,&local_a8,&local_68);
      goto LAB_0010f7f4;
    }
  }
  __return_storage_ptr__->has_error_ = true;
  peVar6 = error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
           ::
           error_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::error_code>
                     (__return_storage_ptr__);
  peVar7 = get_error_category();
  peVar6->_M_value = 1;
  peVar6->_M_cat = peVar7;
LAB_0010f7f4:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> serve_dynamic_content (Sender sender, IO io, std::string uri) {

            // Remove the common path prefix from the URI.
            PSTORE_ASSERT (details::starts_with (uri, dynamic_path));
            uri.erase (std::begin (uri),
                       std::begin (uri) + pstore::array_elements (dynamic_path) - 1U);

            // Extract the command name and any query argument, if we have them.
            auto const pos = uri.find ('?');
            auto const command = uri.substr (0, pos);
            auto it = pos != std::string::npos
                          ? std::begin (uri) + details::clamp_to_signed_max (pos + 1)
                          : std::end (uri);
            query_container arguments;
            if (it != std::end (uri)) {
                it = query_to_kvp (it, std::end (uri),
                                   pstore::http::make_insert_iterator (arguments));
            }

            // Do we know how to handle this command?
            auto const & commands = details::get_commands<Sender, IO> ();
            using value_type = typename details::commands_helper<Sender, IO>::container::value_type;
            auto const compare = [] (value_type const & a, value_type const & b) {
                return std::get<0> (a) < std::get<0> (b);
            };
            PSTORE_ASSERT (std::is_sorted (std::begin (commands), std::end (commands), compare));

            auto const lb = std::lower_bound (
                std::begin (commands), std::end (commands),
                value_type{command, [] (Sender, IO io2,
                                        query_container const &) { return error_or<IO>{io2}; }},
                compare);
            if (lb == std::end (commands) || std::get<0> (*lb) != command) {
                return error_or<IO>{error_code::bad_request};
            }

            // Yep, this is a command we understand. Call it.
            return std::get<1> (*lb) (sender, io, arguments);
        }